

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server_util.cpp
# Opt level: O1

Mining * EnsureMining(NodeContext *node)

{
  Mining *pMVar1;
  UniValue *__return_storage_ptr__;
  long in_FS_OFFSET;
  string local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pMVar1 = (node->mining)._M_t.
           super___uniq_ptr_impl<interfaces::Mining,_std::default_delete<interfaces::Mining>_>._M_t.
           super__Tuple_impl<0UL,_interfaces::Mining_*,_std::default_delete<interfaces::Mining>_>.
           super__Head_base<0UL,_interfaces::Mining_*,_false>._M_head_impl;
  if (pMVar1 == (Mining *)0x0) {
    __return_storage_ptr__ = (UniValue *)__cxa_allocate_exception(0x58);
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"Node miner not found","");
    JSONRPCError(__return_storage_ptr__,-0x7f5b,&local_48);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      __cxa_throw(__return_storage_ptr__,&UniValue::typeinfo,UniValue::~UniValue);
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return pMVar1;
  }
  __stack_chk_fail();
}

Assistant:

interfaces::Mining& EnsureMining(const NodeContext& node)
{
    if (!node.mining) {
        throw JSONRPCError(RPC_INTERNAL_ERROR, "Node miner not found");
    }
    return *node.mining;
}